

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  long in_RDI;
  ImDrawCmd draw_cmd;
  ImDrawCmd *in_stack_ffffffffffffffa8;
  ImDrawCmd *in_stack_ffffffffffffffb0;
  ImVector<ImDrawCmd> *this_00;
  
  ImDrawCmd::ImDrawCmd(in_stack_ffffffffffffffb0);
  if (*(int *)(in_RDI + 0x70) == 0) {
    this_00 = (ImVector<ImDrawCmd> *)0x0;
  }
  else {
    this_00 = *(ImVector<ImDrawCmd> **)
               (*(long *)(in_RDI + 0x78) + (long)(*(int *)(in_RDI + 0x70) + -1) * 8);
  }
  ImVector<ImDrawCmd>::push_back(this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}